

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidySaveStdout(TidyDoc tdoc)

{
  int iVar1;
  TidyDocImpl *doc;
  TidyDoc tdoc_local;
  
  iVar1 = tidyDocSaveStdout((TidyDocImpl *)tdoc);
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveStdout( TidyDoc tdoc )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveStdout( doc );
}